

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O1

void __thiscall CppLogger::CppLogger::printWarn(CppLogger *this,string *t_Message)

{
  pointer pcVar1;
  ostream *poVar2;
  stringstream formatted;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [392];
  
  pcVar1 = (t_Message->_M_dataplus)._M_p;
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1c0,pcVar1,pcVar1 + t_Message->_M_string_length);
  printFormat((CppLogger *)local_1a0,(Level)this,(string *)0x3);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  if ((int)this->m_Level < 4 && this->m_Level != None) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->m_WarnStream,(this->m_WarnColor)._M_dataplus._M_p,
                        (this->m_WarnColor)._M_string_length);
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1e0,local_1d8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,Color::reset_abi_cxx11_,DAT_00107260);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  return;
}

Assistant:

void CppLogger::printWarn(std::string t_Message) {
        std::stringstream formatted = printFormat(Level::Warn, t_Message);
        if (m_Level != Level::None && m_Level <= Level::Warn)
            *m_WarnStream << m_WarnColor << formatted.str() << Color::reset << std::endl;
    }